

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_bid(archive_read *a,wchar_t best_bid)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  char *p;
  archive_entry_header_ustar *header;
  char *h;
  wchar_t bid;
  wchar_t best_bid_local;
  archive_read *a_local;
  
  p = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if (p == (char *)0x0) {
    return L'\xffffffff';
  }
  if ((*p == '\0') && (wVar1 = archive_block_is_null(p), wVar1 != L'\0')) {
    return L'\n';
  }
  wVar1 = checksum(a,p);
  if (wVar1 == L'\0') {
    return L'\0';
  }
  h._0_4_ = 0x30;
  iVar2 = memcmp(p + 0x101,"ustar",6);
  iVar3 = 0x30;
  if ((iVar2 == 0) && (iVar3 = (wchar_t)h, *(short *)(p + 0x107) == 0x3030)) {
    iVar3 = 0x68;
  }
  h._0_4_ = iVar3;
  iVar3 = memcmp(p + 0x101,"ustar ",6);
  if ((iVar3 == 0) && (*(short *)(p + 0x107) == 0x20)) {
    h._0_4_ = (wchar_t)h + 0x38;
  }
  if (((p[0x9c] != '\0') && ((p[0x9c] < '0' || ('9' < p[0x9c])))) &&
     (((p[0x9c] < 'A' || ('Z' < p[0x9c])) && ((p[0x9c] < 'a' || ('z' < p[0x9c])))))) {
    return L'\0';
  }
  h._0_4_ = (wchar_t)h + L'\x02';
  if (((wchar_t)h != L'\0') &&
     ((((wVar1 = validate_number_field(p + 100,8), wVar1 == L'\0' ||
        (wVar1 = validate_number_field(p + 0x6c,8), wVar1 == L'\0')) ||
       (wVar1 = validate_number_field(p + 0x74,8), wVar1 == L'\0')) ||
      (((wVar1 = validate_number_field(p + 0x88,0xc), wVar1 == L'\0' ||
        (wVar1 = validate_number_field(p + 0x7c,0xc), wVar1 == L'\0')) ||
       ((wVar1 = validate_number_field(p + 0x149,8), wVar1 == L'\0' ||
        (wVar1 = validate_number_field(p + 0x151,8), wVar1 == L'\0')))))))) {
    h._0_4_ = L'\0';
  }
  return (wchar_t)h;
}

Assistant:

static int
archive_read_format_tar_bid(struct archive_read *a, int best_bid)
{
	int bid;
	const char *h;
	const struct archive_entry_header_ustar *header;

	(void)best_bid; /* UNUSED */

	bid = 0;

	/* Now let's look at the actual header and see if it matches. */
	h = __archive_read_ahead(a, 512, NULL);
	if (h == NULL)
		return (-1);

	/* If it's an end-of-archive mark, we can handle it. */
	if (h[0] == 0 && archive_block_is_null(h)) {
		/*
		 * Usually, I bid the number of bits verified, but
		 * in this case, 4096 seems excessive so I picked 10 as
		 * an arbitrary but reasonable-seeming value.
		 */
		return (10);
	}

	/* If it's not an end-of-archive mark, it must have a valid checksum.*/
	if (!checksum(a, h))
		return (0);
	bid += 48;  /* Checksum is usually 6 octal digits. */

	header = (const struct archive_entry_header_ustar *)h;

	/* Recognize POSIX formats. */
	if ((memcmp(header->magic, "ustar\0", 6) == 0)
	    && (memcmp(header->version, "00", 2) == 0))
		bid += 56;

	/* Recognize GNU tar format. */
	if ((memcmp(header->magic, "ustar ", 6) == 0)
	    && (memcmp(header->version, " \0", 2) == 0))
		bid += 56;

	/* Type flag must be null, digit or A-Z, a-z. */
	if (header->typeflag[0] != 0 &&
	    !( header->typeflag[0] >= '0' && header->typeflag[0] <= '9') &&
	    !( header->typeflag[0] >= 'A' && header->typeflag[0] <= 'Z') &&
	    !( header->typeflag[0] >= 'a' && header->typeflag[0] <= 'z') )
		return (0);
	bid += 2;  /* 6 bits of variation in an 8-bit field leaves 2 bits. */

	/*
	 * Check format of mode/uid/gid/mtime/size/rdevmajor/rdevminor fields.
	 */
	if (bid > 0 && (
	    validate_number_field(header->mode, sizeof(header->mode)) == 0
	    || validate_number_field(header->uid, sizeof(header->uid)) == 0
	    || validate_number_field(header->gid, sizeof(header->gid)) == 0
	    || validate_number_field(header->mtime, sizeof(header->mtime)) == 0
	    || validate_number_field(header->size, sizeof(header->size)) == 0
	    || validate_number_field(header->rdevmajor, sizeof(header->rdevmajor)) == 0
	    || validate_number_field(header->rdevminor, sizeof(header->rdevminor)) == 0)) {
		bid = 0;
	}

	return (bid);
}